

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void tetrahedralize(tetgenbehavior *b,tetgenio *in,tetgenio *out,tetgenio *addin,tetgenio *bgmin)

{
  clock_t cVar1;
  tetgenbehavior *this;
  clock_t cVar2;
  clock_t cVar3;
  double cps;
  clock_t ts [5];
  clock_t tv [12];
  undefined1 local_630 [8];
  tetgenmesh m;
  tetgenio *bgmin_local;
  tetgenio *addin_local;
  tetgenio *out_local;
  tetgenio *in_local;
  tetgenbehavior *b_local;
  
  m.tsb1mod3._24_8_ = bgmin;
  tetgenmesh::tetgenmesh((tetgenmesh *)local_630);
  cVar1 = clock();
  local_630 = (undefined1  [8])in;
  m.in = addin;
  m.addin = (tetgenio *)b;
  if (((b->metric != 0) && (m.tsb1mod3._24_8_ != 0)) && (0 < *(int *)(m.tsb1mod3._24_8_ + 0x40))) {
    this = (tetgenbehavior *)operator_new(0x600);
    tetgenmesh::tetgenmesh((tetgenmesh *)this);
    *(tetgenbehavior **)&this->nobisect = b;
    this->plc = m.tsb1mod3[6];
    this->psc = m.tsb1mod3[7];
    m.b = this;
  }
  tetgenmesh::initializepools((tetgenmesh *)local_630);
  tetgenmesh::transfernodes((tetgenmesh *)local_630);
  exactinit(b->verbose,b->noexact,b->nostaticfilter,m.minedgelength - m.xmax,m.xmin - m.ymax,
            m.ymin - m.zmax);
  cVar2 = clock();
  if (b->refine == 0) {
    tetgenmesh::incrementaldelaunay((tetgenmesh *)local_630,(clock_t *)&cps);
  }
  else {
    tetgenmesh::reconstructmesh((tetgenmesh *)local_630);
  }
  cVar3 = clock();
  if (b->quiet == 0) {
    if (b->refine == 0) {
      printf("Delaunay seconds:  %g\n",(double)(cVar3 - cVar2) / 1000000.0);
      if (b->verbose != 0) {
        printf("  Point sorting seconds:  %g\n",(double)((long)cps - cVar2) / 1000000.0);
      }
    }
    else {
      printf("Mesh reconstruction seconds:  %g\n",(double)(cVar3 - cVar2) / 1000000.0);
    }
  }
  if ((b->plc != 0) && (b->refine == 0)) {
    tetgenmesh::meshsurface((tetgenmesh *)local_630);
    cps = (double)clock();
    if (b->quiet == 0) {
      printf("Surface mesh seconds:  %g\n",(double)((long)cps - cVar3) / 1000000.0);
    }
    if (b->diagnose != 0) {
      tetgenmesh::detectinterfaces((tetgenmesh *)local_630);
      ts[0] = clock();
      if (b->quiet == 0) {
        printf("Self-intersection seconds:  %g\n",(double)(ts[0] - (long)cps) / 1000000.0);
      }
      if (0 < (m.tetrahedrons)->items) {
        tetgenmesh::outnodes((tetgenmesh *)local_630,out);
        tetgenmesh::outsubfaces((tetgenmesh *)local_630,out);
      }
      goto LAB_0017f404;
    }
  }
  cVar2 = clock();
  if ((b->metric != 0) && (m.b != (tetgenbehavior *)0x0)) {
    tetgenmesh::initializepools((tetgenmesh *)m.b);
    tetgenmesh::transfernodes((tetgenmesh *)m.b);
    tetgenmesh::reconstructmesh((tetgenmesh *)m.b);
    cps = (double)clock();
    if (b->quiet == 0) {
      printf("Background mesh reconstruct seconds:  %g\n",(double)((long)cps - cVar2) / 1000000.0);
    }
    if (b->metric != 0) {
      tetgenmesh::interpolatemeshsize((tetgenmesh *)local_630);
      ts[0] = clock();
      if (b->quiet == 0) {
        printf("Size interpolating seconds:  %g\n",(double)(ts[0] - (long)cps) / 1000000.0);
      }
    }
  }
  cVar2 = clock();
  if ((b->plc != 0) && (b->refine == 0)) {
    if (b->nobisect == 0) {
      tetgenmesh::constraineddelaunay((tetgenmesh *)local_630,(clock_t *)&cps);
    }
    else {
      tetgenmesh::recoverboundary((tetgenmesh *)local_630,(clock_t *)&cps);
    }
    ts[0] = clock();
    if (b->quiet == 0) {
      if (b->nobisect == 0) {
        printf("Constrained Delaunay ");
      }
      else {
        printf("Boundary recovery ");
      }
      printf("seconds:  %g\n",(double)(ts[0] - cVar2) / 1000000.0);
      if (b->verbose != 0) {
        printf("  Segment recovery seconds:  %g\n",(double)((long)cps - cVar2) / 1000000.0);
        printf("  Facet recovery seconds:  %g\n",(double)(ts[0] - (long)cps) / 1000000.0);
      }
    }
    tetgenmesh::carveholes((tetgenmesh *)local_630);
    ts[1] = clock();
    if (b->quiet == 0) {
      printf("Exterior tets removal seconds:  %g\n",(double)(ts[1] - ts[0]) / 1000000.0);
    }
    if ((b->nobisect != 0) && (0 < (m.subfacstack)->objects)) {
      tetgenmesh::suppresssteinerpoints((tetgenmesh *)local_630);
      ts[2] = clock();
      if (b->quiet == 0) {
        printf("Steiner suppression seconds:  %g\n",(double)(ts[2] - ts[1]) / 1000000.0);
      }
    }
  }
  cVar2 = clock();
  if (b->coarsen != 0) {
    tetgenmesh::meshcoarsening((tetgenmesh *)local_630);
  }
  cVar3 = clock();
  if ((b->quiet == 0) && (b->coarsen != 0)) {
    printf("Mesh coarsening seconds:  %g\n",(double)(cVar3 - cVar2) / 1000000.0);
  }
  if (((b->plc != 0) && (b->nobisect != 0)) || (b->coarsen != 0)) {
    tetgenmesh::recoverdelaunay((tetgenmesh *)local_630);
  }
  cVar2 = clock();
  if ((b->quiet == 0) && (((b->plc != 0 && (b->nobisect != 0)) || (b->coarsen != 0)))) {
    printf("Delaunay recovery seconds:  %g\n",(double)(cVar2 - cVar3) / 1000000.0);
  }
  if (((b->plc != 0) || (b->refine != 0)) &&
     ((b->insertaddpoints != 0 && ((addin != (tetgenio *)0x0 && (0 < addin->numberofpoints)))))) {
    tetgenmesh::insertconstrainedpoints((tetgenmesh *)local_630,addin);
  }
  cVar3 = clock();
  if ((b->quiet == 0) &&
     ((((b->plc != 0 || (b->refine != 0)) && (b->insertaddpoints != 0)) &&
      ((addin != (tetgenio *)0x0 && (0 < addin->numberofpoints)))))) {
    printf("Constrained points seconds:  %g\n",(double)(cVar3 - cVar2) / 1000000.0);
  }
  if (b->quality != 0) {
    tetgenmesh::delaunayrefinement((tetgenmesh *)local_630);
  }
  cVar2 = clock();
  if ((b->quiet == 0) && (b->quality != 0)) {
    printf("Refinement seconds:  %g\n",(double)(cVar2 - cVar3) / 1000000.0);
  }
  if (((b->plc != 0) || (b->refine != 0)) && (0 < b->optlevel)) {
    tetgenmesh::optimizemesh((tetgenmesh *)local_630);
  }
  cVar3 = clock();
  if (((b->quiet == 0) && ((b->plc != 0 || (b->refine != 0)))) && (0 < b->optlevel)) {
    printf("Optimization seconds:  %g\n",(double)(cVar3 - cVar2) / 1000000.0);
  }
  if ((b->nojettison == 0) &&
     (((0 < m.steinerleft || (0 < m.dupverts)) || ((b->refine != 0 && (in->numberofcorners == 10))))
     )) {
    tetgenmesh::jettisonnodes((tetgenmesh *)local_630);
  }
  if ((b->order == 2) && (b->convex == 0)) {
    tetgenmesh::highorder((tetgenmesh *)local_630);
  }
  if (b->quiet == 0) {
    printf("\n");
  }
  if (out != (tetgenio *)0x0) {
    out->firstnumber = in->firstnumber;
    out->mesh_dim = in->mesh_dim;
  }
  if ((b->nonodewritten == 0) && (b->noiterationnum == 0)) {
    tetgenmesh::outnodes((tetgenmesh *)local_630,out);
  }
  else if (b->quiet == 0) {
    printf("NOT writing a .node file.\n");
  }
  if (b->noelewritten == 0) {
    if (0 < (long)(m.bgm)->tet2subpool) {
      tetgenmesh::outelements((tetgenmesh *)local_630,out);
    }
  }
  else {
    if (b->quiet == 0) {
      printf("NOT writing an .ele file.\n");
    }
    tetgenmesh::indexelements((tetgenmesh *)local_630);
  }
  if (b->nofacewritten == 0) {
    if (b->facesout == 0) {
      if ((b->plc == 0) && (b->refine == 0)) {
        if (0 < (long)(m.bgm)->tet2subpool) {
          tetgenmesh::outhullfaces((tetgenmesh *)local_630,out);
        }
      }
      else if (0 < (m.tetrahedrons)->items) {
        tetgenmesh::outsubfaces((tetgenmesh *)local_630,out);
      }
    }
    else if (0 < (long)(m.bgm)->tet2subpool) {
      tetgenmesh::outfaces((tetgenmesh *)local_630,out);
    }
  }
  else if (b->quiet == 0) {
    printf("NOT writing an .face file.\n");
  }
  if (b->nofacewritten == 0) {
    if (b->edgesout == 0) {
      if ((b->plc != 0) || (b->refine != 0)) {
        tetgenmesh::outsubsegments((tetgenmesh *)local_630,out);
      }
    }
    else {
      tetgenmesh::outedges((tetgenmesh *)local_630,out);
    }
  }
  else if (b->quiet == 0) {
    printf("NOT writing an .edge file.\n");
  }
  if (((b->plc != 0) || (b->refine != 0)) && (b->metric != 0)) {
    tetgenmesh::outmetrics((tetgenmesh *)local_630,out);
  }
  if (((out == (tetgenio *)0x0) && (b->plc != 0)) &&
     ((b->object == OFF || ((b->object == PLY || (b->object == STL)))))) {
    tetgenmesh::outsmesh((tetgenmesh *)local_630,b->outfilename);
  }
  if ((out == (tetgenio *)0x0) && (b->meditview != 0)) {
    tetgenmesh::outmesh2medit((tetgenmesh *)local_630,b->outfilename);
  }
  if ((out == (tetgenio *)0x0) && (b->vtkview != 0)) {
    tetgenmesh::outmesh2vtk((tetgenmesh *)local_630,b->outfilename);
  }
  if (b->neighout != 0) {
    tetgenmesh::outneighbors((tetgenmesh *)local_630,out);
  }
  if (b->voroout != 0) {
    tetgenmesh::outvoronoi((tetgenmesh *)local_630,out);
  }
  cVar2 = clock();
  if (b->quiet == 0) {
    printf("\nOutput seconds:  %g\n",(double)(cVar2 - cVar3) / 1000000.0);
    printf("Total running seconds:  %g\n",(double)(cVar2 - cVar1) / 1000000.0);
  }
  if (b->docheck != 0) {
    tetgenmesh::checkmesh((tetgenmesh *)local_630,0);
    if ((b->plc != 0) || (b->refine != 0)) {
      tetgenmesh::checkshells((tetgenmesh *)local_630);
      tetgenmesh::checksegments((tetgenmesh *)local_630);
    }
    if (1 < b->docheck) {
      tetgenmesh::checkdelaunay((tetgenmesh *)local_630,1);
    }
  }
  if (b->quiet == 0) {
    tetgenmesh::statistics((tetgenmesh *)local_630);
  }
LAB_0017f404:
  tetgenmesh::~tetgenmesh((tetgenmesh *)local_630);
  return;
}

Assistant:

void tetrahedralize(tetgenbehavior *b, tetgenio *in, tetgenio *out,
                    tetgenio *addin, tetgenio *bgmin)
{
  tetgenmesh m;
  clock_t tv[12], ts[5]; // Timing informations (defined in time.h)
  REAL cps = (REAL) CLOCKS_PER_SEC;

  tv[0] = clock();
 
  m.b = b;
  m.in = in;
  m.addin = addin;

  if (b->metric && bgmin && (bgmin->numberofpoints > 0)) {
    m.bgm = new tetgenmesh(); // Create an empty background mesh.
    m.bgm->b = b;
    m.bgm->in = bgmin;
  }

  m.initializepools();
  m.transfernodes();

  exactinit(b->verbose, b->noexact, b->nostaticfilter,
            m.xmax - m.xmin, m.ymax - m.ymin, m.zmax - m.zmin);

  tv[1] = clock();

  if (b->refine) { // -r
    m.reconstructmesh();
  } else { // -p
    m.incrementaldelaunay(ts[0]);
  }

  tv[2] = clock();

  if (!b->quiet) {
    if (b->refine) {
      printf("Mesh reconstruction seconds:  %g\n", ((REAL)(tv[2]-tv[1])) / cps);
    } else {
      printf("Delaunay seconds:  %g\n", ((REAL)(tv[2]-tv[1])) / cps);
      if (b->verbose) {
        printf("  Point sorting seconds:  %g\n", ((REAL)(ts[0]-tv[1])) / cps);
      }
    }
  }

  if (b->plc && !b->refine) { // -p
    m.meshsurface();

    ts[0] = clock();

    if (!b->quiet) {
      printf("Surface mesh seconds:  %g\n", ((REAL)(ts[0]-tv[2])) / cps);
    }

    if (b->diagnose) { // -d
      m.detectinterfaces();

      ts[1] = clock();

      if (!b->quiet) {
        printf("Self-intersection seconds:  %g\n", ((REAL)(ts[1]-ts[0])) / cps);
      }

      // Only output when self-intersecting faces exist.
      if (m.subfaces->items > 0l) {
        m.outnodes(out);
        m.outsubfaces(out);
      }

      return;
    }
  }

  tv[3] = clock();

  if ((b->metric) && (m.bgm != NULL)) { // -m
    m.bgm->initializepools();
    m.bgm->transfernodes();
    m.bgm->reconstructmesh();

    ts[0] = clock();

    if (!b->quiet) {
      printf("Background mesh reconstruct seconds:  %g\n",
             ((REAL)(ts[0] - tv[3])) / cps);
    }

    if (b->metric) { // -m
      m.interpolatemeshsize();

      ts[1] = clock();

      if (!b->quiet) {
        printf("Size interpolating seconds:  %g\n",((REAL)(ts[1]-ts[0])) / cps);
      }
    }
  }

  tv[4] = clock();

  if (b->plc && !b->refine) { // -p
    if (b->nobisect) { // -Y
      m.recoverboundary(ts[0]);
    } else {
      m.constraineddelaunay(ts[0]);
    }

    ts[1] = clock();

    if (!b->quiet) {
      if (b->nobisect) {
        printf("Boundary recovery ");
      } else {
        printf("Constrained Delaunay ");
      }
      printf("seconds:  %g\n", ((REAL)(ts[1] - tv[4])) / cps);
      if (b->verbose) {
        printf("  Segment recovery seconds:  %g\n",((REAL)(ts[0]-tv[4]))/ cps);
        printf("  Facet recovery seconds:  %g\n", ((REAL)(ts[1]-ts[0])) / cps);
      }
    }

    m.carveholes();

    ts[2] = clock();

    if (!b->quiet) {
      printf("Exterior tets removal seconds:  %g\n",((REAL)(ts[2]-ts[1]))/cps);
    }

    if (b->nobisect) { // -Y
      if (m.subvertstack->objects > 0l) {
        m.suppresssteinerpoints();

        ts[3] = clock();

        if (!b->quiet) {
          printf("Steiner suppression seconds:  %g\n",
                 ((REAL)(ts[3]-ts[2]))/cps);
        }
      }
    }
  }

  tv[5] = clock();

  if (b->coarsen) { // -R
    m.meshcoarsening();
  }

  tv[6] = clock();

  if (!b->quiet) {
    if (b->coarsen) {
      printf("Mesh coarsening seconds:  %g\n", ((REAL)(tv[6] - tv[5])) / cps);
    }
  }

  if ((b->plc && b->nobisect) || b->coarsen) {
    m.recoverdelaunay();
  }

  tv[7] = clock();

  if (!b->quiet) {
    if ((b->plc && b->nobisect) || b->coarsen) {
      printf("Delaunay recovery seconds:  %g\n", ((REAL)(tv[7] - tv[6]))/cps);
    }
  }

  if ((b->plc || b->refine) && b->insertaddpoints) { // -i
    if ((addin != NULL) && (addin->numberofpoints > 0)) {
      m.insertconstrainedpoints(addin); 
    }
  }

  tv[8] = clock();

  if (!b->quiet) {
    if ((b->plc || b->refine) && b->insertaddpoints) { // -i
      if ((addin != NULL) && (addin->numberofpoints > 0)) {
        printf("Constrained points seconds:  %g\n", ((REAL)(tv[8]-tv[7]))/cps);
      }
    }
  }

  if (b->quality) {
    m.delaunayrefinement();    
  }

  tv[9] = clock();

  if (!b->quiet) {
    if (b->quality) {
      printf("Refinement seconds:  %g\n", ((REAL)(tv[9] - tv[8])) / cps);
    }
  }

  if ((b->plc || b->refine) && (b->optlevel > 0)) {
    m.optimizemesh();
  }

  tv[10] = clock();

  if (!b->quiet) {
    if ((b->plc || b->refine) && (b->optlevel > 0)) {
      printf("Optimization seconds:  %g\n", ((REAL)(tv[10] - tv[9])) / cps);
    }
  }

  if (!b->nojettison && ((m.dupverts > 0) || (m.unuverts > 0)
      || (b->refine && (in->numberofcorners == 10)))) {
    m.jettisonnodes();
  }

  if ((b->order == 2) && !b->convex) {
    m.highorder();
  }

  if (!b->quiet) {
    printf("\n");
  }

  if (out != (tetgenio *) NULL) {
    out->firstnumber = in->firstnumber;
    out->mesh_dim = in->mesh_dim;
  }

  if (b->nonodewritten || b->noiterationnum) {
    if (!b->quiet) {
      printf("NOT writing a .node file.\n");
    }
  } else {
    m.outnodes(out);
  }

  if (b->noelewritten) {
    if (!b->quiet) {
      printf("NOT writing an .ele file.\n");
    }
    m.indexelements();
  } else {
    if (m.tetrahedrons->items > 0l) {
      m.outelements(out);
    }
  }

  if (b->nofacewritten) {
    if (!b->quiet) {
      printf("NOT writing an .face file.\n");
    }
  } else {
    if (b->facesout) {
      if (m.tetrahedrons->items > 0l) {
        m.outfaces(out);  // Output all faces.
      }
    } else {
      if (b->plc || b->refine) {
        if (m.subfaces->items > 0l) {
          m.outsubfaces(out); // Output boundary faces.
        }
      } else {
        if (m.tetrahedrons->items > 0l) {
          m.outhullfaces(out); // Output convex hull faces.
        }
      }
    }
  }


  if (b->nofacewritten) {
    if (!b->quiet) {
      printf("NOT writing an .edge file.\n");
    }
  } else {
    if (b->edgesout) { // -e
      m.outedges(out); // output all mesh edges. 
    } else {
      if (b->plc || b->refine) {
        m.outsubsegments(out); // output subsegments.
      }
    }
  }

  if ((b->plc || b->refine) && b->metric) { // -m
    m.outmetrics(out);
  }

  if (!out && b->plc && 
      ((b->object == tetgenbehavior::OFF) ||
       (b->object == tetgenbehavior::PLY) ||
       (b->object == tetgenbehavior::STL))) {
    m.outsmesh(b->outfilename);
  }

  if (!out && b->meditview) {
    m.outmesh2medit(b->outfilename); 
  }


  if (!out && b->vtkview) {
    m.outmesh2vtk(b->outfilename); 
  }

  if (b->neighout) {
    m.outneighbors(out);
  }

  if (b->voroout) {
    m.outvoronoi(out);
  }


  tv[11] = clock();

  if (!b->quiet) {
    printf("\nOutput seconds:  %g\n", ((REAL)(tv[11] - tv[10])) / cps);
    printf("Total running seconds:  %g\n", ((REAL)(tv[11] - tv[0])) / cps);
  }

  if (b->docheck) {
    m.checkmesh(0);
    if (b->plc || b->refine) {
      m.checkshells();
      m.checksegments();
    }
    if (b->docheck > 1) {
      m.checkdelaunay();
    }
  }

  if (!b->quiet) {
    m.statistics();
  }
}